

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<long,_double>::Run
          (DataTransform<long,_double> *this,istream *input_stream)

{
  double dVar1;
  NumericType NVar2;
  WarningType WVar3;
  double dVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ostream *poVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  bool bVar13;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  long input_data;
  string word;
  char buffer [128];
  ulong local_290;
  double local_288;
  undefined8 uStack_280;
  string *local_278;
  double local_270;
  double local_268;
  ulong local_260;
  ulong local_258;
  string local_250;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_278 = &this->print_format_;
  dVar12 = 0.0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      local_288 = dVar12;
      if (local_228 == 0) {
        bVar13 = true;
        bVar5 = false;
      }
      else {
        piVar6 = __errno_location();
        iVar11 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_250);
        if (local_250._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_00127e14:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar11;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_00127e14;
        }
        local_290 = (ulong)ROUND(in_ST0);
        bVar13 = false;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_258 = local_290;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      iVar11 = SUB84(local_288,0);
      dVar12 = local_288;
      if (bVar5) goto LAB_00127af7;
      if (bVar13) {
        if (!bVar13) {
          return false;
        }
        goto LAB_00127dc0;
      }
    }
    else {
      bVar5 = sptk::ReadStream<long>((long *)&local_290,input_stream);
      if (!bVar5) {
LAB_00127dc0:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if ((int)((long)((ulong)(uint)(SUB84(dVar12,0) >> 0x1f) << 0x20 | (ulong)dVar12 & 0xffffffff
                        ) % (long)this->num_column_) != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_00127af7:
      iVar11 = SUB84(dVar12,0);
      dVar12 = this->minimum_value_;
      uVar14 = SUB84(dVar12,0);
      uVar15 = (undefined4)((ulong)dVar12 >> 0x20);
      dVar1 = this->maximum_value_;
      if (dVar1 <= dVar12) {
LAB_00127caa:
        dVar12 = (double)(long)local_290;
        in_ST7 = in_ST6;
        if (this->rounding_ == true) {
          if ((long)local_290 < 1) {
            dVar12 = dVar12 + -0.5;
          }
          else {
            dVar12 = dVar12 + 0.5;
          }
        }
      }
      else {
        NVar2 = this->input_numeric_type_;
        uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
        if (NVar2 == kFloatingPoint) {
          local_260 = local_290;
          dVar4 = (double)(long)local_290;
          in_ST6 = in_ST5;
          local_268 = dVar12;
          if (dVar12 <= dVar4) {
            bVar5 = dVar4 == dVar1;
            bVar13 = dVar4 < dVar1;
            local_270 = dVar1;
LAB_00127bf0:
            uVar14 = SUB84(dVar1,0);
            uVar15 = uVar16;
            if (bVar13 || bVar5) goto LAB_00127caa;
          }
        }
        else if (NVar2 == kUnsignedInteger) {
          if ((ulong)((long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12)
              <= local_290) {
            uVar10 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
            bVar13 = local_290 < uVar10;
            bVar5 = local_290 == uVar10;
            goto LAB_00127bf0;
          }
        }
        else if ((NVar2 != kSignedInteger) ||
                (((long)dVar12 <= (long)local_290 &&
                 (uVar14 = SUB84(dVar1,0), uVar15 = uVar16, (long)local_290 <= (long)dVar1))))
        goto LAB_00127caa;
        in_ST7 = in_ST6;
        dVar12 = (double)CONCAT44(uVar15,uVar14);
        if (this->warning_type_ != kIgnore) {
          local_288 = (double)CONCAT44(uVar15,uVar14);
          uStack_280 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"x2x","");
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          dVar12 = local_288;
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar5 = sptk::SnPrintf<double>(dVar12,local_278,0x80,local_b8);
        if (!bVar5) {
          return false;
        }
        sVar9 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9);
        if ((iVar11 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        bVar5 = sptk::WriteStream<double>(dVar12,(ostream *)&std::cout);
        if (!bVar5) {
          return false;
        }
      }
    }
    dVar12 = (double)(ulong)(iVar11 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }